

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

ProStringList * __thiscall QMakeEvaluator::valuesRef(QMakeEvaluator *this,ProKey *variableName)

{
  bool bVar1;
  QList<ProString> *this_00;
  const_iterator cVar2;
  ProKey *in_RSI;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  ProStringList *ret;
  ConstIterator it_1;
  iterator vmi;
  Iterator it;
  ProStringList *in_stack_ffffffffffffff68;
  QList<ProString> *in_stack_ffffffffffffff70;
  ProKey *in_stack_ffffffffffffff80;
  QMap<ProKey,_ProStringList> *in_stack_ffffffffffffff88;
  ProKey *this_01;
  ProStringList *local_58;
  _Self local_50;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  _Self local_30;
  _List_iterator<QMap<ProKey,_ProStringList>_> local_28;
  const_iterator local_20;
  iterator local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  ProValueMapStack::top((ProValueMapStack *)0x2f6fdb);
  local_10._M_node =
       (_Base_ptr)
       QMap<ProKey,_ProStringList>::find(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  ProValueMapStack::top((ProValueMapStack *)0x2f7001);
  local_18._M_node =
       (_Base_ptr)
       QMap<ProKey,_ProStringList>::end((QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffff80);
  bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff70,(iterator *)in_stack_ffffffffffffff68);
  if (bVar1) {
    QMap<ProKey,_ProStringList>::iterator::operator->((iterator *)0x2f7039);
    local_20 = QList<ProString>::constBegin(in_stack_ffffffffffffff70);
    cVar2 = QList<ProString>::constBegin(in_stack_ffffffffffffff70);
    bVar1 = QList<ProString>::const_iterator::operator==(&local_20,cVar2);
    if (bVar1) {
      QMap<ProKey,_ProStringList>::iterator::operator->((iterator *)0x2f7080);
      QList<ProString>::clear(in_stack_ffffffffffffff70);
    }
    local_58 = QMap<ProKey,_ProStringList>::iterator::operator*((iterator *)0x2f7095);
  }
  else {
    bVar1 = isFunctParam(in_RDI);
    if (!bVar1) {
      local_28._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::end
                     ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       *)in_stack_ffffffffffffff70);
      this_00 = (QList<ProString> *)
                std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator--(&local_28);
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::begin
                     ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       *)this_00);
      bVar1 = std::operator!=((_Self *)this_00,&local_30);
      if (bVar1) {
        do {
          std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator--(&local_28);
          local_38._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
          std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator*
                    ((_List_iterator<QMap<ProKey,_ProStringList>_> *)0x2f7132);
          local_38._M_node =
               (_Base_ptr)
               QMap<ProKey,_ProStringList>::constFind
                         ((QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffff68,
                          (ProKey *)0x2f713f);
          std::_List_iterator<QMap<ProKey,_ProStringList>_>::operator*
                    ((_List_iterator<QMap<ProKey,_ProStringList>_> *)0x2f714e);
          local_40._M_node =
               (_Base_ptr)
               QMap<ProKey,_ProStringList>::constEnd
                         ((QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffff68);
          bVar1 = ::operator!=((const_iterator *)this_00,(const_iterator *)in_stack_ffffffffffffff68
                              );
          if (bVar1) {
            ProValueMapStack::top((ProValueMapStack *)0x2f7193);
            local_58 = QMap<ProKey,_ProStringList>::operator[]
                                 ((QMap<ProKey,_ProStringList> *)this_01,in_RSI);
            QMap<ProKey,_ProStringList>::const_iterator::operator->((const_iterator *)0x2f71af);
            local_48 = QList<ProString>::constBegin(this_00);
            cVar2 = QList<ProString>::constBegin(this_00);
            bVar1 = QList<ProString>::const_iterator::operator!=(&local_48,cVar2);
            if (bVar1) {
              QMap<ProKey,_ProStringList>::const_iterator::operator*((const_iterator *)0x2f71f3);
              ProStringList::operator=((ProStringList *)this_00,in_stack_ffffffffffffff68);
            }
            goto LAB_002f7262;
          }
          local_50._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
               begin((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                      *)this_00);
          bVar1 = std::operator!=(&local_28,&local_50);
        } while (bVar1);
      }
    }
    ProValueMapStack::top((ProValueMapStack *)0x2f7250);
    local_58 = QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)this_01,in_RSI);
  }
LAB_002f7262:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

ProStringList &QMakeEvaluator::valuesRef(const ProKey &variableName)
{
    ProValueMap::Iterator it = m_valuemapStack.top().find(variableName);
    if (it != m_valuemapStack.top().end()) {
        if (it->constBegin() == statics.fakeValue.constBegin())
            it->clear();
        return *it;
    }
    if (!isFunctParam(variableName)) {
        ProValueMapStack::iterator vmi = m_valuemapStack.end();
        if (--vmi != m_valuemapStack.begin()) {
            do {
                --vmi;
                ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
                if (it != (*vmi).constEnd()) {
                    ProStringList &ret = m_valuemapStack.top()[variableName];
                    if (it->constBegin() != statics.fakeValue.constBegin())
                        ret = *it;
                    return ret;
                }
            } while (vmi != m_valuemapStack.begin());
        }
    }
    return m_valuemapStack.top()[variableName];
}